

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O2

bool Assimp::SkipLine<char>(char *in,char **out)

{
  byte *pbVar1;
  byte bVar2;
  
  while( true ) {
    bVar2 = *in;
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
    in = (char *)((byte *)in + 1);
  }
  while ((bVar2 == 0xd || (bVar2 == 10))) {
    pbVar1 = (byte *)in + 1;
    in = (char *)((byte *)in + 1);
    bVar2 = *pbVar1;
  }
  *out = in;
  return *in != 0;
}

Assistant:

AI_FORCE_INLINE
bool SkipLine( const char_t* in, const char_t** out) {
    while( *in != ( char_t )'\r' && *in != ( char_t )'\n' && *in != ( char_t )'\0' ) {
        ++in;
    }

    // files are opened in binary mode. Ergo there are both NL and CR
    while( *in == ( char_t )'\r' || *in == ( char_t )'\n' ) {
        ++in;
    }
    *out = in;
    return *in != (char_t)'\0';
}